

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StressTest.cpp
# Opt level: O1

void __thiscall StressTester::CreateTreeHelper(StressTester *this,TestObject *root,int depth)

{
  int iVar1;
  size_t extraBytes;
  TestObject *pTVar2;
  long lVar3;
  int iVar4;
  Recycler *this_00;
  Recycler *recycler;
  TestObject **data;
  ulong uVar5;
  
  if (0 < root->pointerCount) {
    uVar5 = (ulong)((long)&root[2].size + 7U) & 0xffffffffffffffe0;
    iVar4 = 0;
    this_00 = (Recycler *)this;
    do {
      recycler = this->recycler;
      if ((depth == 0) || (1000 < this->treeTotal)) {
        iVar1 = PAL_rand();
        pTVar2 = TestObject::Create(recycler,0,(long)iVar1,LeafObj);
        if (0 < (long)root->pointerCount) {
          lVar3 = 0;
          do {
            if (*(long *)(uVar5 + lVar3 * 8) == 0) {
              *(TestObject **)(uVar5 + lVar3 * 8) = pTVar2;
              break;
            }
            lVar3 = lVar3 + 1;
          } while (root->pointerCount != lVar3);
        }
      }
      else {
        extraBytes = GetRandomSize((StressTester *)this_00);
        pTVar2 = TestObject::Create(recycler,4,extraBytes,NormalObj);
        recycler = (Recycler *)this;
        CreateTreeHelper(this,pTVar2,depth + -1);
        if (0 < (long)root->pointerCount) {
          lVar3 = 0;
          do {
            if (*(long *)(uVar5 + lVar3 * 8) == 0) {
              *(TestObject **)(uVar5 + lVar3 * 8) = pTVar2;
              break;
            }
            lVar3 = lVar3 + 1;
          } while (root->pointerCount != lVar3);
        }
      }
      this->treeTotal = this->treeTotal + 1;
      iVar4 = iVar4 + 1;
      this_00 = recycler;
    } while (iVar4 < root->pointerCount);
  }
  return;
}

Assistant:

void StressTester::CreateTreeHelper(TestObject *root, int depth) {
    for (int i = 0; i < root->pointerCount; ++i, ++treeTotal)
    {
        if (depth == 0 || treeTotal > MaxNodesInTree)
        {
            root->Add(TestObject::Create(recycler, 0, rand(), LeafObj));
        }
        else
        {
            TestObject *newObj = TestObject::Create(recycler, 4, GetRandomSize());
            CreateTreeHelper(newObj, depth - 1);
            root->Add(newObj);
        }
    }
}